

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O3

void __thiscall Vertex::mutateVertex(Vertex *this)

{
  int iVar1;
  pointer pcVar2;
  pointer piVar3;
  bool bVar4;
  size_type sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  string temp_seq;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar2 = (this->seq)._M_dataplus._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar2,pcVar2 + (this->seq)._M_string_length);
  sVar5 = (this->seq)._M_string_length;
  if (this->treshhold < 6) {
    if (0 < (int)sVar5) {
      iVar6 = 0;
      bVar4 = false;
      do {
        piVar3 = (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (uint)((ulong)((long)(this->qual_list).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2
                      );
        if ((int)uVar8 < 1) {
          if (bVar4) break;
LAB_00102716:
          bVar4 = false;
        }
        else {
          if (bVar4) break;
          iVar7 = this->quality;
          uVar10 = 0xffffffff;
          uVar11 = 0;
          do {
            iVar9 = piVar3[uVar11];
            if (iVar9 < iVar7) {
              piVar3[uVar11] = 100;
              uVar10 = uVar11 & 0xffffffff;
              iVar7 = iVar9;
            }
            uVar11 = uVar11 + 1;
          } while ((uVar8 & 0x7fffffff) != uVar11);
          if ((int)uVar10 == -1) goto LAB_00102716;
          *(undefined1 *)((long)local_30[0] + (long)(int)uVar10) = 0x58;
          sVar5 = (this->seq)._M_string_length;
          bVar4 = true;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < (int)sVar5);
    }
  }
  else if (0 < (int)sVar5) {
    iVar6 = 0;
    iVar7 = 0;
    do {
      piVar3 = (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (uint)((ulong)((long)(this->qual_list).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
      if ((int)uVar8 < 1) {
        if (iVar7 == 2) break;
      }
      else {
        if (iVar7 == 2) break;
        iVar9 = this->quality;
        uVar10 = 0xffffffff;
        uVar11 = 0;
        do {
          iVar1 = piVar3[uVar11];
          if (iVar1 < iVar9) {
            piVar3[uVar11] = 100;
            uVar10 = uVar11 & 0xffffffff;
            iVar9 = iVar1;
          }
          uVar11 = uVar11 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar11);
        if ((int)uVar10 != -1) {
          *(undefined1 *)((long)local_30[0] + (long)(int)uVar10) = 0x58;
          iVar7 = iVar7 + 1;
          sVar5 = (this->seq)._M_string_length;
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < (int)sVar5);
  }
  std::__cxx11::string::_M_assign((string *)&this->seq_del);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void Vertex::mutateVertex(){
    string temp_seq = this->seq;
    int min_index = 0, min = 0, count = 0;
    if(this->treshhold > 5){
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count == 2)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count == 2)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
        this->seq_del = temp_seq;
        return void();
    }else{
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
    }
    this->seq_del = temp_seq;
    return void();
}